

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
::operator()(precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
             *this,basic_string_view<char> id)

{
  basic_format_specs<char> *pbVar1;
  undefined1 local_39;
  format_arg local_38;
  
  pbVar1 = (this->handler->
           super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           ).super_specs_setter<char>.specs_;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
  get_arg(&local_38,
          (this->handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ).context_,id);
  set_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
            (&pbVar1->precision_,&local_39);
  return;
}

Assistant:

FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
    handler.on_dynamic_precision(id);
  }